

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astTupleSlotNamedReferenceAtNode_primitiveCompileIntoBytecode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  sysbvm_tuple_t *psVar2;
  sysbvm_tuple_t typeSlot;
  sysbvm_tuple_t result;
  sysbvm_tuple_t type;
  undefined1 local_78 [8];
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_24_3_973aa3f0 gcFrame;
  sysbvm_astTupleSlotNamedReferenceAtNode_t **slotNamedNode;
  sysbvm_functionBytecodeDirectCompiler_t **compiler;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  psVar2 = arguments + 1;
  memset(&gcFrameRecord.roots,0,0x18);
  memset(local_78,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_JIT_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_78);
  gcFrameRecord.roots =
       (sysbvm_tuple_t *)
       sysbvm_functionBytecodeDirectCompiler_compileASTNode
                 (context,(sysbvm_functionBytecodeDirectCompiler_t *)*psVar2,
                  *(sysbvm_tuple_t *)(*arguments + 0x28));
  typeSlot = sysbvm_functionBytecodeAssembler_addLiteral
                       (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar2 + 0x10),
                        *(sysbvm_tuple_t *)(*arguments + 0x38));
  result = sysbvm_functionBytecodeAssembler_newTemporary
                     (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar2 + 0x10),
                      *(sysbvm_tuple_t *)(*arguments + 0x20));
  type = sysbvm_astNode_getAnalyzedType(*(sysbvm_tuple_t *)(*arguments + 0x28));
  _Var1 = sysbvm_type_isPointerLikeType(type);
  if (_Var1) {
    sysbvm_functionBytecodeAssembler_refSlotReferenceAt
              (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar2 + 0x10),result,
               (sysbvm_tuple_t)gcFrameRecord.roots,typeSlot);
  }
  else {
    sysbvm_functionBytecodeAssembler_slotReferenceAt
              (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar2 + 0x10),result,
               (sysbvm_tuple_t)gcFrameRecord.roots,typeSlot);
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_78);
  return result;
}

Assistant:

static sysbvm_tuple_t sysbvm_astTupleSlotNamedReferenceAtNode_primitiveCompileIntoBytecode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_functionBytecodeDirectCompiler_t **compiler = (sysbvm_functionBytecodeDirectCompiler_t **)&arguments[1];

    sysbvm_astTupleSlotNamedReferenceAtNode_t **slotNamedNode = (sysbvm_astTupleSlotNamedReferenceAtNode_t**)node;
    struct {
        sysbvm_tuple_t tuple;
        sysbvm_tuple_t slot;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.tuple = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*slotNamedNode)->tupleExpression);
    gcFrame.slot = sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, (*slotNamedNode)->boundSlot);
    gcFrame.result = sysbvm_functionBytecodeAssembler_newTemporary(context, (*compiler)->assembler, (*slotNamedNode)->super.analyzedType);
    if(sysbvm_type_isPointerLikeType(sysbvm_astNode_getAnalyzedType((*slotNamedNode)->tupleExpression)))
        sysbvm_functionBytecodeAssembler_refSlotReferenceAt(context, (*compiler)->assembler, gcFrame.result, gcFrame.tuple, gcFrame.slot);
    else
        sysbvm_functionBytecodeAssembler_slotReferenceAt(context, (*compiler)->assembler, gcFrame.result, gcFrame.tuple, gcFrame.slot);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}